

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterSymbols.cpp
# Opt level: O2

void slang::ast::TypeParameterSymbol::fromSyntax
               (Scope *scope,TypeParameterDeclarationSyntax *syntax,bool isLocal,bool isPort,
               SmallVectorBase<slang::ast::TypeParameterSymbol_*> *results)

{
  undefined1 *puVar1;
  Compilation *this;
  TypeAssignmentSyntax *pTVar2;
  DiagCode code;
  ForwardTypeRestriction typeRestriction;
  SourceLocation loc;
  const_iterator __begin2;
  TypeParameterSymbol *param;
  string_view name;
  bool local_6e;
  bool local_6d;
  ForwardTypeRestriction local_6c;
  SourceLocation local_68;
  iterator_base<const_slang::syntax::TypeAssignmentSyntax_*> local_60;
  ulong local_50;
  TypeParameterSymbol *local_48;
  string_view local_40;
  
  this = scope->compilation;
  local_6c = None;
  local_6e = isPort;
  local_6d = isLocal;
  if (syntax->typeRestriction != (ForwardTypeRestrictionSyntax *)0x0) {
    local_6c = SemanticFacts::getTypeRestriction(syntax->typeRestriction);
  }
  local_60.index = 0;
  local_50 = (syntax->declarators).elements._M_extent._M_extent_value + 1 >> 1;
  local_60.list = &syntax->declarators;
  do {
    if ((local_60.list == &syntax->declarators) && (local_60.index == local_50)) {
      return;
    }
    pTVar2 = slang::syntax::SeparatedSyntaxList<slang::syntax::TypeAssignmentSyntax>::
             iterator_base<const_slang::syntax::TypeAssignmentSyntax_*>::dereference(&local_60);
    local_40 = parsing::Token::valueText(&pTVar2->name);
    local_68 = parsing::Token::location(&pTVar2->name);
    local_48 = BumpAllocator::
               emplace<slang::ast::TypeParameterSymbol,slang::ast::Scope_const&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,bool&,bool&,slang::ast::ForwardTypeRestriction&>
                         (&this->super_BumpAllocator,scope,&local_40,&local_68,&local_6d,&local_6e,
                          &local_6c);
    (local_48->super_Symbol).originatingSyntax = &pTVar2->super_SyntaxNode;
    if (pTVar2->assignment == (EqualsTypeClauseSyntax *)0x0) {
      (local_48->targetType).type = this->errorType;
      if (local_6e == false) {
        code.subsystem = Declarations;
        code.code = 0xe;
      }
      else {
        if (local_6d != true) goto LAB_001ff910;
        code.subsystem = Declarations;
        code.code = 0x6a;
      }
      Scope::addDiag(scope,code,local_68);
    }
    else {
      (local_48->targetType).typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(pTVar2->assignment->type).ptr;
      puVar1 = &(local_48->targetType).field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
    }
LAB_001ff910:
    SmallVectorBase<slang::ast::TypeParameterSymbol*>::
    emplace_back<slang::ast::TypeParameterSymbol*const&>
              ((SmallVectorBase<slang::ast::TypeParameterSymbol*> *)results,&local_48);
    local_60.index = local_60.index + 1;
  } while( true );
}

Assistant:

void TypeParameterSymbol::fromSyntax(const Scope& scope,
                                     const TypeParameterDeclarationSyntax& syntax, bool isLocal,
                                     bool isPort, SmallVectorBase<TypeParameterSymbol*>& results) {
    auto& comp = scope.getCompilation();
    auto typeRestriction = ForwardTypeRestriction::None;
    if (syntax.typeRestriction)
        typeRestriction = SemanticFacts::getTypeRestriction(*syntax.typeRestriction);

    for (auto decl : syntax.declarators) {
        auto name = decl->name.valueText();
        auto loc = decl->name.location();

        auto param = comp.emplace<TypeParameterSymbol>(scope, name, loc, isLocal, isPort,
                                                       typeRestriction);
        param->setSyntax(*decl);

        if (!decl->assignment) {
            param->targetType.setType(comp.getErrorType());
            if (!isPort)
                scope.addDiag(diag::BodyParamNoInitializer, loc);
            else if (isLocal)
                scope.addDiag(diag::LocalParamNoInitializer, loc);
        }
        else {
            param->targetType.setTypeSyntax(*decl->assignment->type);
        }

        results.push_back(param);
    }
}